

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_recvmsg(int s,nn_msghdr *msghdr,int flags)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  nn_cmsghdr *pnVar3;
  size_t sVar4;
  char *pcVar5;
  void *pvVar6;
  void *pvVar7;
  char *ptr;
  nn_sock *sock;
  nn_cmsghdr *chdr;
  size_t sptotalsz;
  size_t spsz;
  size_t ctrlsz;
  void *ctrl;
  size_t hdrssz;
  void *chunk;
  nn_iovec *iov;
  size_t sStack_a8;
  int i;
  size_t sz;
  uint8_t *data;
  nn_msg msg;
  int rc;
  int flags_local;
  nn_msghdr *msghdr_local;
  int s_local;
  
  msg.body.u._28_4_ = flags;
  msg.body.u._24_4_ = nn_global_hold_socket((nn_sock **)&ptr,s);
  if ((int)msg.body.u._24_4_ < 0) {
    iVar1 = -msg.body.u._24_4_;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  else {
    if (msghdr == (nn_msghdr *)0x0) {
      msg.body.u._24_4_ = 0xffffffea;
    }
    else if (msghdr->msg_iovlen < 0) {
      msg.body.u._24_4_ = 0xffffffa6;
    }
    else {
      msg.body.u._24_4_ = nn_sock_recv((nn_sock *)ptr,(nn_msg *)&data,msg.body.u._28_4_);
      if (-1 < (int)msg.body.u._24_4_) {
        if ((msghdr->msg_iovlen == 1) && (msghdr->msg_iov->iov_len == 0xffffffffffffffff)) {
          hdrssz = (size_t)nn_chunkref_getchunk((nn_chunkref *)((long)&msg.hdrs.u + 0x18));
          *(size_t *)msghdr->msg_iov->iov_base = hdrssz;
          sStack_a8 = nn_chunk_size((void *)hdrssz);
        }
        else {
          sz = (size_t)nn_chunkref_data((nn_chunkref *)((long)&msg.hdrs.u + 0x18));
          sStack_a8 = nn_chunkref_size((nn_chunkref *)((long)&msg.hdrs.u + 0x18));
          for (iov._4_4_ = 0; iov._4_4_ != msghdr->msg_iovlen; iov._4_4_ = iov._4_4_ + 1) {
            chunk = msghdr->msg_iov + iov._4_4_;
            if (((nn_iovec *)chunk)->iov_len == 0xffffffffffffffff) {
              nn_msg_term((nn_msg *)&data);
              msg.body.u._24_4_ = 0xffffffea;
              goto LAB_0011167e;
            }
            if (sStack_a8 < ((nn_iovec *)chunk)->iov_len) {
              memcpy(((nn_iovec *)chunk)->iov_base,(void *)sz,sStack_a8);
              break;
            }
            memcpy(((nn_iovec *)chunk)->iov_base,(void *)sz,((nn_iovec *)chunk)->iov_len);
            sz = *(long *)((long)chunk + 8) + sz;
            sStack_a8 = sStack_a8 - *(long *)((long)chunk + 8);
          }
          sStack_a8 = nn_chunkref_size((nn_chunkref *)((long)&msg.hdrs.u + 0x18));
        }
        if (msghdr->msg_control != (void *)0x0) {
          sptotalsz = nn_chunkref_size((nn_chunkref *)&data);
          pnVar3 = (nn_cmsghdr *)((sptotalsz + 0xf & 0xfffffffffffffff8) + 0x10);
          chdr = pnVar3;
          sVar4 = nn_chunkref_size((nn_chunkref *)((long)&msg.sphdr.u + 0x18));
          spsz = (long)&pnVar3->cmsg_len + sVar4;
          if (msghdr->msg_controllen == 0xffffffffffffffff) {
            msg.body.u._24_4_ = nn_chunk_alloc(spsz,0,(void **)&ctrlsz);
            if (msg.body.u._24_4_ != 0) {
              nn_backtrace_print();
              __stream = _stderr;
              pcVar5 = nn_err_strerror(-msg.body.u._24_4_);
              fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar5,(ulong)(uint)-msg.body.u._24_4_,
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/global.c"
                      ,0x3a4);
              fflush(_stderr);
              nn_err_abort();
            }
            *(size_t *)msghdr->msg_control = ctrlsz;
            msg.body.u._24_4_ = 0;
          }
          else {
            ctrlsz = (size_t)msghdr->msg_control;
            spsz = msghdr->msg_controllen;
          }
          if (chdr <= spsz) {
            sock = (nn_sock *)ctrlsz;
            *(nn_cmsghdr **)ctrlsz = chdr;
            *(undefined4 *)(ctrlsz + 8) = 1;
            *(undefined4 *)(ctrlsz + 0xc) = 1;
            *(size_t *)(ctrlsz + 0x10) = sptotalsz;
            pvVar6 = (void *)(ctrlsz + 0x18);
            pvVar7 = nn_chunkref_data((nn_chunkref *)&data);
            memcpy(pvVar6,pvVar7,sptotalsz);
            ctrl = (void *)nn_chunkref_size((nn_chunkref *)((long)&msg.sphdr.u + 0x18));
            if ((void *)(spsz - (long)chdr) < ctrl) {
              ctrl = (void *)(spsz - (long)chdr);
            }
            pvVar6 = (void *)((long)&chdr->cmsg_len + ctrlsz);
            pvVar7 = nn_chunkref_data((nn_chunkref *)((long)&msg.sphdr.u + 0x18));
            memcpy(pvVar6,pvVar7,(size_t)ctrl);
          }
        }
        nn_msg_term((nn_msg *)&data);
        nn_sock_stat_increment((nn_sock *)ptr,0x12e,1);
        nn_sock_stat_increment((nn_sock *)ptr,0x130,sStack_a8);
        nn_global_rele_socket((nn_sock *)ptr);
        return (int)sStack_a8;
      }
    }
LAB_0011167e:
    nn_global_rele_socket((nn_sock *)ptr);
    iVar1 = -msg.body.u._24_4_;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return -1;
}

Assistant:

int nn_recvmsg (int s, struct nn_msghdr *msghdr, int flags)
{
    int rc;
    struct nn_msg msg;
    uint8_t *data;
    size_t sz;
    int i;
    struct nn_iovec *iov;
    void *chunk;
    size_t hdrssz;
    void *ctrl;
    size_t ctrlsz;
    size_t spsz;
    size_t sptotalsz;
    struct nn_cmsghdr *chdr;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!msghdr)) {
        rc = -EINVAL;
        goto fail;
    }

    if (nn_slow (msghdr->msg_iovlen < 0)) {
        rc = -EMSGSIZE;
        goto fail;
    }

    /*  Get a message. */
    rc = nn_sock_recv (sock, &msg, flags);
    if (nn_slow (rc < 0)) {
        goto fail;
    }

    if (msghdr->msg_iovlen == 1 && msghdr->msg_iov [0].iov_len == NN_MSG) {
        chunk = nn_chunkref_getchunk (&msg.body);
        *(void**) (msghdr->msg_iov [0].iov_base) = chunk;
        sz = nn_chunk_size (chunk);
    }
    else {

        /*  Copy the message content into the supplied gather array. */
        data = nn_chunkref_data (&msg.body);
        sz = nn_chunkref_size (&msg.body);
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            if (nn_slow (iov->iov_len == NN_MSG)) {
                nn_msg_term (&msg);
                rc = -EINVAL;
                goto fail;
            }
            if (iov->iov_len > sz) {
                memcpy (iov->iov_base, data, sz);
                break;
            }
            memcpy (iov->iov_base, data, iov->iov_len);
            data += iov->iov_len;
            sz -= iov->iov_len;
        }
        sz = nn_chunkref_size (&msg.body);
    }

    /*  Retrieve the ancillary data from the message. */
    if (msghdr->msg_control) {

        spsz = nn_chunkref_size (&msg.sphdr);
        sptotalsz = NN_CMSG_SPACE (spsz+sizeof (size_t));
        ctrlsz = sptotalsz + nn_chunkref_size (&msg.hdrs);

        if (msghdr->msg_controllen == NN_MSG) {

            /* Allocate the buffer. */
            rc = nn_chunk_alloc (ctrlsz, 0, &ctrl);
            errnum_assert (rc == 0, -rc);

            /* Set output parameters. */
            *((void**) msghdr->msg_control) = ctrl;
        }
        else {

            /* Just use the buffer supplied by the user. */
            ctrl = msghdr->msg_control;
            ctrlsz = msghdr->msg_controllen;
        }

        /* If SP header alone won't fit into the buffer, return no ancillary
           properties. */
        if (ctrlsz >= sptotalsz) {
            char *ptr;

            /*  Fill in SP_HDR ancillary property. */
            chdr = (struct nn_cmsghdr*) ctrl;
            chdr->cmsg_len = sptotalsz;
            chdr->cmsg_level = PROTO_SP;
            chdr->cmsg_type = SP_HDR;
            ptr = (void *)chdr;
            ptr += sizeof (*chdr);
            *(size_t *)(void *)ptr = spsz;
            ptr += sizeof (size_t);
            memcpy (ptr, nn_chunkref_data (&msg.sphdr), spsz);

            /*  Fill in as many remaining properties as possible.
                Truncate the trailing properties if necessary. */
            hdrssz = nn_chunkref_size (&msg.hdrs);
            if (hdrssz > ctrlsz - sptotalsz)
                hdrssz = ctrlsz - sptotalsz;
            memcpy (((char*) ctrl) + sptotalsz,
                nn_chunkref_data (&msg.hdrs), hdrssz);
        }
    }

    nn_msg_term (&msg);

    /*  Adjust the statistics. */
    nn_sock_stat_increment (sock, NN_STAT_MESSAGES_RECEIVED, 1);
    nn_sock_stat_increment (sock, NN_STAT_BYTES_RECEIVED, sz);

    nn_global_rele_socket (sock);

    return (int) sz;

fail:
    nn_global_rele_socket (sock);

    errno = -rc;
    return -1;
}